

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

int lj_cconv_multi_init(CTState *cts,CType *d,TValue *o)

{
  uint32_t uVar1;
  uint uVar2;
  CType *pCVar3;
  int iVar4;
  
  uVar2 = d->info & 0xf0000000;
  iVar4 = 0;
  if (((d->info & 0xfc000000) == 0x30000000 || uVar2 == 0x10000000) &&
     (uVar1 = (o->field_2).it, uVar1 != 0xfffffff4)) {
    if (uVar1 == 0xfffffff5) {
      pCVar3 = lj_ctype_rawref(cts,(uint)*(ushort *)((ulong)(o->u32).lo + 6));
      if (pCVar3 == d) {
        return 0;
      }
    }
    else if ((uVar1 == 0xfffffffb) && (uVar2 != 0x10000000)) {
      return 0;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int lj_cconv_multi_init(CTState *cts, CType *d, TValue *o)
{
  if (!(ctype_isrefarray(d->info) || ctype_isstruct(d->info)))
    return 0;  /* Destination is not an aggregate. */
  if (tvistab(o) || (tvisstr(o) && !ctype_isstruct(d->info)))
    return 0;  /* Initializer is not a value. */
  if (tviscdata(o) && lj_ctype_rawref(cts, cdataV(o)->ctypeid) == d)
    return 0;  /* Source and destination are identical aggregates. */
  return 1;  /* Otherwise the initializer is a value. */
}